

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_3> * __thiscall
tcu::normalize<double,3>(Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *a)

{
  int i;
  long lVar1;
  Type TVar2;
  
  TVar2 = length<double,3>((Vector<double,_3> *)this);
  Vector<double,_3>::Vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    __return_storage_ptr__->m_data[lVar1] = *(double *)(this + lVar1 * 8) * (1.0 / TVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}